

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void Assimp::FBX::ResolveVertexDataArray<aiVector2t<float>>
               (vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *data_out,
               Scope *source,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  pointer pcVar1;
  uint uVar2;
  pointer paVar3;
  pointer paVar4;
  Scope *pSVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  Element *pEVar10;
  long lVar11;
  pointer piVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  byte bVar19;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> tempData;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator local_229;
  string local_228;
  Scope *local_200;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_1f8;
  vector<int,_std::allocator<int>_> local_1d8;
  char *local_1c0;
  char *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  local_200 = source;
  local_1b8 = dataElementName;
  iVar8 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1b0 = ReferenceInformationType;
  iVar9 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  bVar7 = true;
  bVar15 = true;
  if (iVar9 == 0) {
    std::__cxx11::string::string((string *)local_1a8,indexDataElementName,(allocator *)&local_228);
    bVar7 = HasElement(local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    bVar15 = !bVar7;
  }
  bVar19 = iVar8 != 0 & bVar7;
  local_1c0 = indexDataElementName;
  iVar8 = std::__cxx11::string::compare((char *)MappingInformationType);
  pcVar6 = local_1b8;
  if ((bVar19 == 0) && (iVar8 == 0)) {
    std::__cxx11::string::string((string *)local_1a8,local_1b8,(allocator *)&local_228);
    pSVar5 = local_200;
    bVar15 = HasElement(local_200,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    if (!bVar15) {
      return;
    }
    local_228._M_dataplus._M_p = (pointer)0x0;
    local_228._M_string_length = 0;
    local_228.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)local_1a8,pcVar6,(allocator *)&local_1f8);
    pEVar10 = GetRequiredElement(pSVar5,(string *)local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_228,pEVar10)
    ;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
    std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
              (data_out,vertex_count);
    _Var18._M_p = local_228._M_dataplus._M_p;
    if (local_228._M_string_length - (long)local_228._M_dataplus._M_p != 0) {
      lVar11 = (long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 3;
      lVar13 = 0;
      do {
        uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar13];
        uVar14 = (ulong)uVar2;
        uVar16 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar13] + uVar2;
        if (uVar2 < uVar16) {
          do {
            (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start
            [(mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar14]] =
                 *(aiVector2t<float> *)(local_228._M_dataplus._M_p + lVar13 * 8);
            uVar14 = uVar14 + 1;
          } while (uVar16 != uVar14);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11 + (ulong)(lVar11 == 0));
    }
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)MappingInformationType);
    if ((bool)(iVar8 != 0 | bVar15)) {
      iVar8 = std::__cxx11::string::compare((char *)MappingInformationType);
      if (bVar19 == 0 && iVar8 == 0) {
        local_228._M_dataplus._M_p = (pointer)0x0;
        local_228._M_string_length = 0;
        local_228.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string((string *)local_1a8,local_1b8,(allocator *)&local_1f8);
        pEVar10 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)&local_228,
                   pEVar10);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_);
        }
        if ((long)(local_228._M_string_length - (long)local_228._M_dataplus._M_p) >> 3 ==
            vertex_count) {
          _Var18._M_p = (pointer)(data_out->
                                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._M_dataplus._M_p;
          paVar3 = (data_out->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          paVar4 = (data_out->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._M_string_length;
          (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_228.field_2._M_allocated_capacity;
          local_228._M_dataplus._M_p = _Var18._M_p;
          local_228._M_string_length = (size_type)paVar3;
          local_228.field_2._M_allocated_capacity = (size_type)paVar4;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          _Var18._M_p = local_228._M_dataplus._M_p;
        }
        goto LAB_0018bef4;
      }
      iVar8 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((bool)(bVar15 | iVar8 != 0)) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,local_1b0->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        return;
      }
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1a8,local_1b8,(allocator *)&local_228);
      pSVar5 = local_200;
      pEVar10 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
      pcVar6 = local_1c0;
      ParseVectorDataArray(&local_1f8,pEVar10);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_);
      }
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                (data_out,vertex_count);
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1a8,pcVar6,(allocator *)&local_228);
      pEVar10 = GetRequiredElement(pSVar5,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1d8,pEVar10);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar14 = 0;
          piVar12 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar17 = (ulong)*piVar12;
            if (uVar17 == 0xffffffffffffffff) {
              paVar3 = (data_out->
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar14;
              paVar3->x = 0.0;
              paVar3->y = 0.0;
            }
            else {
              if ((ulong)((long)local_1f8.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1f8.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar17) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string((string *)&local_228,local_1c0,&local_229);
                pEVar10 = GetRequiredElement(local_200,&local_228,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar10);
              }
              (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start[uVar14] =
                   local_1f8.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar17];
            }
            uVar14 = (ulong)((int)uVar14 + 1);
            piVar12 = piVar12 + 1;
          } while (piVar12 !=
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x18bf1c);
      }
    }
    else {
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1a8,local_1b8,(allocator *)&local_228);
      pSVar5 = local_200;
      pEVar10 = GetRequiredElement(local_200,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1f8,pEVar10);
      pcVar1 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_);
      }
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize
                (data_out,vertex_count);
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_1a8,local_1c0,(allocator *)&local_228);
      pEVar10 = GetRequiredElement(pSVar5,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_1d8,pEVar10);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar11 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar13 = 0;
        do {
          uVar2 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar13];
          uVar14 = (ulong)uVar2;
          uVar16 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar13] + uVar2;
          if (uVar2 < uVar16) {
            do {
              if ((ulong)((long)local_1f8.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1f8.
                                super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) <=
                  (ulong)(long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar13]) {
                local_1a8._0_8_ = pcVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string((string *)&local_228,local_1c0,&local_229);
                pEVar10 = GetRequiredElement(local_200,&local_228,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar10);
              }
              (data_out->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start
              [(mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar14]] =
                   local_1f8.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13]];
              uVar14 = uVar14 + 1;
            } while (uVar16 != uVar14);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar11 + (ulong)(lVar11 == 0));
      }
    }
    _Var18._M_p = (pointer)local_1f8.
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      _Var18._M_p = (pointer)local_1f8.
                             super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
    }
  }
LAB_0018bef4:
  if ((pointer)_Var18._M_p != (pointer)0x0) {
    operator_delete(_Var18._M_p);
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}